

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_1in_1out.c
# Opt level: O1

ErrorNumber test_func_1in_1out(TA_History *history)

{
  int endIdx;
  int startIdx;
  TA_Real *pTVar1;
  TA_RetCode TVar2;
  TA_RetCode TVar3;
  ErrorNumber EVar4;
  TestBuffer *pTVar5;
  int *piVar6;
  long lVar7;
  TA_Real *pTVar8;
  TA_Test_conflict *pTVar9;
  TA_FuncUnstId unstId;
  uint integerTolerance;
  ulong uVar10;
  ulong uVar11;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_History *local_78;
  ulong local_70;
  long local_68;
  TA_Test_conflict *local_60;
  TA_Real *local_58;
  long local_50;
  TA_Real *local_48;
  TestBuffer *local_40;
  TestBuffer *local_38;
  
  local_38 = (TestBuffer *)&history->close;
  local_40 = gBuffer + 1;
  uVar11 = 0;
  local_78 = history;
  do {
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    if ((int)history->nbBars < tableTest[uVar11].expectedNbElement) {
      printf("Failed Bad Parameter for Test #%d (%d,%d)\n",uVar11 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    pTVar9 = tableTest + uVar11;
    local_70 = uVar11;
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    pTVar5 = local_38;
    if (tableTest[uVar11].theFunction < TA_ACCBANDS_TEST) {
      TA_MEDPRICE(0,history->nbBars - 1,history->high,history->low,&outBegIdx,&outNbElement,
                  gBuffer[0].in);
      TA_MEDPRICE(0,history->nbBars - 1,history->high,history->low,&outBegIdx,&outNbElement,
                  gBuffer[1].in);
      pTVar5 = local_40;
    }
    pTVar8 = pTVar5->in;
    endIdx = tableTest[uVar11].endIdx;
    startIdx = tableTest[uVar11].startIdx;
    local_68 = CONCAT44(local_68._4_4_,endIdx - startIdx);
    switch(tableTest[uVar11].theFunction) {
    case TA_ANY_MA_TEST:
      TVar2 = TA_HT_DCPERIOD(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0)
      ;
      history = local_78;
      break;
    case TA_AD_TEST:
      TVar2 = TA_HT_DCPHASE(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0);
      history = local_78;
      break;
    case TA_ADOSC_3_10_TEST:
      TVar2 = TA_HT_TRENDLINE(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0
                             );
      history = local_78;
      break;
    case TA_ADOSC_5_2_TEST:
      lVar7 = (long)(endIdx - startIdx);
      local_48 = pTVar8;
      piVar6 = (int *)malloc(lVar7 * 4 + 0xc);
      *piVar6 = -0x54540124;
      piVar6[lVar7 + 2] = -0x10543201;
      local_50 = lVar7;
      TVar3 = TA_HT_TRENDMODE(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,piVar6 + 1);
      history = local_78;
      pTVar8 = gBuffer[0].out0;
      TVar2 = 0x1412;
      if (((*piVar6 == -0x54540124) && (TVar2 = 0x1413, piVar6[local_50 + 2] == -0x10543201)) &&
         (TVar2 = TVar3, 0 < (long)outNbElement)) {
        lVar7 = 0;
        do {
          pTVar8[lVar7] = (double)piVar6[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (outNbElement != lVar7);
      }
      free(piVar6);
      pTVar8 = local_48;
      break;
    case TA_ACCBANDS_TEST:
      TVar2 = TA_SIN(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0);
      history = local_78;
      break;
    default:
      TVar2 = 0x140d;
      history = local_78;
    }
    EVar4 = checkDataSame(gBuffer[0].in,pTVar8,history->nbBars);
    if (EVar4 == TA_TEST_PASS) {
      EVar4 = checkExpectedValue(gBuffer[0].out0,TVar2,tableTest[uVar11].expectedRetCode,outBegIdx,
                                 tableTest[uVar11].expectedBegIdx,outNbElement,
                                 tableTest[uVar11].expectedNbElement,
                                 tableTest[uVar11].oneOfTheExpectedOutReal0,
                                 tableTest[uVar11].oneOfTheExpectedOutRealIndex0);
      if (EVar4 != TA_TEST_PASS) {
LAB_00114302:
        printf("Fail for output id=%d\n");
        goto LAB_00114315;
      }
      outNbElement = 0;
      outBegIdx = 0;
      switch(tableTest[uVar11].theFunction) {
      case TA_ANY_MA_TEST:
        TVar2 = TA_HT_DCPERIOD(tableTest[uVar11].startIdx,tableTest[uVar11].endIdx,gBuffer[0].in,
                               &outBegIdx,&outNbElement,gBuffer[0].in);
        break;
      case TA_AD_TEST:
        TVar2 = TA_HT_DCPHASE(tableTest[uVar11].startIdx,tableTest[uVar11].endIdx,gBuffer[0].in,
                              &outBegIdx,&outNbElement,gBuffer[0].in);
        break;
      case TA_ADOSC_3_10_TEST:
        TVar2 = TA_HT_TRENDLINE(tableTest[uVar11].startIdx,tableTest[uVar11].endIdx,gBuffer[0].in,
                                &outBegIdx,&outNbElement,gBuffer[0].in);
        break;
      case TA_ADOSC_5_2_TEST:
        lVar7 = (long)(int)local_68;
        piVar6 = (int *)malloc(lVar7 * 4 + 0xc);
        *piVar6 = -0x54540124;
        piVar6[lVar7 + 2] = -0x10543201;
        local_68 = lVar7;
        TVar3 = TA_HT_TRENDMODE(tableTest[uVar11].startIdx,tableTest[uVar11].endIdx,gBuffer[0].in,
                                &outBegIdx,&outNbElement,piVar6 + 1);
        pTVar1 = gBuffer[0].in;
        TVar2 = 0x1412;
        if (((*piVar6 == -0x54540124) && (TVar2 = 0x1413, piVar6[local_68 + 2] == -0x10543201)) &&
           (TVar2 = TVar3, 0 < (long)outNbElement)) {
          lVar7 = 0;
          do {
            pTVar1[lVar7] = (double)piVar6[lVar7 + 1];
            lVar7 = lVar7 + 1;
          } while (outNbElement != lVar7);
        }
        free(piVar6);
        break;
      case TA_ACCBANDS_TEST:
        TVar2 = TA_SIN(tableTest[uVar11].startIdx,tableTest[uVar11].endIdx,gBuffer[0].in,&outBegIdx,
                       &outNbElement,gBuffer[0].in);
        break;
      default:
        TVar2 = 0x140e;
      }
      EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[0].in);
      if (EVar4 != TA_TEST_PASS) goto LAB_00114315;
      EVar4 = checkExpectedValue(gBuffer[0].in,TVar2,tableTest[uVar11].expectedRetCode,outBegIdx,
                                 tableTest[uVar11].expectedBegIdx,outNbElement,
                                 tableTest[uVar11].expectedNbElement,
                                 tableTest[uVar11].oneOfTheExpectedOutReal0,
                                 tableTest[uVar11].oneOfTheExpectedOutRealIndex0);
      uVar10 = local_70;
      if (EVar4 != TA_TEST_PASS) goto LAB_00114302;
      local_60 = pTVar9;
      local_58 = pTVar8;
      if (pTVar9->doRangeTestFlag != 0) {
        switch(tableTest[uVar11].theFunction) {
        case TA_ANY_MA_TEST:
          unstId = TA_FUNC_UNST_HT_DCPERIOD;
          break;
        case TA_AD_TEST:
          unstId = TA_FUNC_UNST_HT_DCPHASE;
          integerTolerance = 0x168;
          goto LAB_00114583;
        case TA_ADOSC_3_10_TEST:
          unstId = TA_FUNC_UNST_HT_TRENDLINE;
          break;
        case TA_ADOSC_5_2_TEST:
          unstId = TA_FUNC_UNST_HT_TRENDMODE;
          break;
        default:
          unstId = TA_FUNC_UNST_NONE;
        }
        integerTolerance = 0;
LAB_00114583:
        EVar4 = doRangeTest(rangeTestFunction,unstId,&local_60,1,integerTolerance);
        uVar11 = (ulong)EVar4;
        if (EVar4 != TA_TEST_PASS) goto LAB_0011431a;
      }
      uVar11 = 0;
    }
    else {
LAB_00114315:
      uVar11 = (ulong)EVar4;
      uVar10 = local_70;
    }
LAB_0011431a:
    if ((ErrorNumber)uVar11 != TA_TEST_PASS) {
      printf("Failed Test #%d (Code=%d)\n",uVar10 & 0xffffffff,uVar11);
      return (ErrorNumber)uVar11;
    }
    uVar11 = uVar10 + 1;
    if (uVar11 == 0xe) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_1in_1out( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {
      /* Re-initialize all the unstable period to zero. */
      TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}